

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

void __thiscall Assimp::Ogre::VertexData::~VertexData(VertexData *this)

{
  VertexData *this_local;
  
  Reset(this);
  std::
  map<unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>_>_>
  ::~map(&this->vertexBindings);
  std::vector<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>::~vector
            (&this->vertexElements);
  IVertexData::~IVertexData(&this->super_IVertexData);
  return;
}

Assistant:

VertexData::~VertexData()
{
    Reset();
}